

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O2

void __thiscall
adios2::query::BlockIndex<unsigned_char>::RunStatMinBlocksInfo
          (BlockIndex<unsigned_char> *this,QueryVar *query,MinVarInfo *MinBlocksInfo,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  bool bVar1;
  ulong uVar2;
  pointer pMVar3;
  RangeTree *this_00;
  uchar bmax;
  uchar bmin;
  Dims cc;
  Dims ss;
  Box<adios2::Dims> box;
  uchar local_da;
  uchar local_d9;
  RangeTree *local_d8;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *local_d0;
  QueryVar *local_c8;
  BlockIndex<unsigned_char> *local_c0;
  pointer local_b8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  BlockHit local_80;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  
  local_b8 = (MinBlocksInfo->BlocksInfo).
             super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl
             .super__Vector_impl_data._M_finish;
  this_00 = &query->m_RangeTree;
  local_d8 = this_00;
  local_d0 = hitBlocks;
  local_c8 = query;
  local_c0 = this;
  for (pMVar3 = (MinBlocksInfo->BlocksInfo).
                super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar3 != local_b8; pMVar3 = pMVar3 + 1) {
    local_d9 = (pMVar3->MinMax).MinUnion.field_int8;
    local_da = (pMVar3->MinMax).MaxUnion.field_int8;
    bVar1 = RangeTree::CheckInterval<unsigned_char>(this_00,&local_d9,&local_da);
    if (bVar1) {
      if ((local_c0->m_VarPtr->super_VariableBase).m_ShapeID == LocalArray) {
        BlockHit::BlockHit((BlockHit *)&local_60,pMVar3->BlockID);
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
        emplace_back<adios2::query::BlockHit>(local_d0,(BlockHit *)&local_60);
        std::
        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~vector((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)&local_60.first.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                   (long)MinBlocksInfo->Dims,(allocator_type *)&local_60);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,
                   (long)MinBlocksInfo->Dims,(allocator_type *)&local_60);
        for (uVar2 = 0;
            uVar2 < (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_98._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar2 = uVar2 + 1) {
          local_98._M_impl.super__Vector_impl_data._M_start[uVar2] = pMVar3->Start[uVar2];
          local_b0._M_impl.super__Vector_impl_data._M_start[uVar2] = pMVar3->Count[uVar2];
        }
        bVar1 = QueryVar::TouchSelection(local_c8,(Dims *)&local_98,(Dims *)&local_b0);
        if (bVar1) {
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (&local_60,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0);
          BlockHit::BlockHit(&local_80,pMVar3->BlockID,&local_60);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
          emplace_back<adios2::query::BlockHit>(local_d0,&local_80);
          this_00 = local_d8;
          std::
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::~vector(&local_80.m_Regions);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(&local_60);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_b0)
          ;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98)
          ;
        }
        else {
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_b0)
          ;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98)
          ;
          this_00 = local_d8;
        }
      }
    }
  }
  return;
}

Assistant:

void RunStatMinBlocksInfo(const QueryVar &query, const adios2::MinVarInfo *MinBlocksInfo,
                              std::vector<BlockHit> &hitBlocks)
    {
        for (auto &blockInfo : MinBlocksInfo->BlocksInfo)
        {
            T bmin = *(T *)&blockInfo.MinMax.MinUnion;
            T bmax = *(T *)&blockInfo.MinMax.MaxUnion;
            bool isHit = query.m_RangeTree.CheckInterval(bmin, bmax);

            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID != adios2::ShapeID::LocalArray)
            {
                Dims ss(MinBlocksInfo->Dims);
                Dims cc(MinBlocksInfo->Dims);
                for (std::vector<int>::size_type i = 0; i < ss.size(); i++)
                {
                    ss[i] = blockInfo.Start[i];
                    cc[i] = blockInfo.Count[i];
                }
                if (!query.TouchSelection(ss, cc))
                    continue;

                if (isHit)
                {
                    adios2::Box<adios2::Dims> box = {ss, cc};
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
                }
            }
            else
            { // local array
                hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
        }
    }